

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

void __thiscall QDebug::QDebug(QDebug *this,QString *string)

{
  Stream *this_00;
  
  this_00 = (Stream *)operator_new(0x58);
  Stream::Stream(this_00,string);
  this->stream = this_00;
  return;
}

Assistant:

explicit QDebug(QString *string) : stream(new Stream(string)) {}